

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yabmp_stream.h
# Opt level: O1

yabmp_status yabmp_stream_read_le_32u(yabmp *instance,yabmp_uint32 *value)

{
  size_t sVar1;
  
  if (value == (yabmp_uint32 *)0x0) {
    __assert_fail("value != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/mayeut[P]yabmp/lib/yabmp/src/../inc/private/yabmp_stream.h"
                  ,0x68,"yabmp_status yabmp_stream_read_le_32u(yabmp *, yabmp_uint32 *)");
  }
  if (instance->read_fn != (yabmp_stream_read_cb)0x0) {
    sVar1 = (*instance->read_fn)(instance->stream_context,value,4);
    if (sVar1 == 4) {
      instance->stream_offset = instance->stream_offset + 4;
    }
    return (uint)(sVar1 != 4);
  }
  __assert_fail("instance->read_fn != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/mayeut[P]yabmp/lib/yabmp/src/../inc/private/yabmp_stream.h"
                ,0x69,"yabmp_status yabmp_stream_read_le_32u(yabmp *, yabmp_uint32 *)");
}

Assistant:

YABMP_UNUSED
static yabmp_status yabmp_stream_read_le_32u(yabmp* instance, yabmp_uint32* value)
{
	yabmp_status l_status = YABMP_OK;
	
	assert(instance != NULL);
	assert(value != NULL);
	assert(instance->read_fn != NULL);
	/* if we're on a little endian machine, just read directly */
	if (instance->read_fn(instance->stream_context, value, 4U) != 4U) {
		l_status = YABMP_ERR_UNKNOW;
	} else {
		instance->stream_offset += 4U;
#if defined(YABMP_BIG_ENDIAN)
		*value = yabmp_bswap32(*value);
#endif
	}
	return l_status;
}